

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator-debug.c
# Opt level: O0

int emulator_add_empty_breakpoint(void)

{
  long lVar1;
  int local_1c;
  Breakpoint *bp;
  int id;
  
  bp._0_4_ = 0;
  while( true ) {
    if (0xff < (int)bp) {
      return -1;
    }
    lVar1 = (long)(int)bp;
    if ((s_breakpoints[lVar1].field_0x7 & 1) == 0) break;
    bp._0_4_ = (int)bp + 1;
  }
  s_breakpoints[lVar1].id = (int)bp;
  s_breakpoints[lVar1].bank = '\0';
  s_breakpoints[lVar1].addr = 0;
  s_breakpoints[lVar1].field_0x7 = s_breakpoints[lVar1].field_0x7 & 0xfd;
  s_breakpoints[lVar1].field_0x7 = s_breakpoints[lVar1].field_0x7 & 0xfe | 1;
  if (s_breakpoint_max_id < (int)bp + 1) {
    local_1c = (int)bp + 1;
  }
  else {
    local_1c = s_breakpoint_max_id;
  }
  s_breakpoint_max_id = local_1c;
  s_breakpoint_count = s_breakpoint_count + 1;
  return (int)bp;
}

Assistant:

int emulator_add_empty_breakpoint(void) {
  int id;
  for (id = 0; id < MAX_BREAKPOINTS; ++id) {
    Breakpoint* bp = &s_breakpoints[id];
    if (!bp->valid) {
      bp->id = id;
      bp->addr = bp->bank = 0;
      bp->enabled = FALSE;
      bp->valid = TRUE;
      s_breakpoint_max_id = MAX(id + 1, s_breakpoint_max_id);
      ++s_breakpoint_count;
      return id;
    }
  }
  return -1;
}